

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O2

void conf_set_fontspec(Conf *conf,int primary,FontSpec *value)

{
  conf_entry *entry;
  FontSpec *pFVar1;
  
  entry = (conf_entry *)safemalloc(1,0x18,0);
  if (subkeytypes[primary] != 0) {
    __assert_fail("subkeytypes[primary] == TYPE_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                  0x1f0,"void conf_set_fontspec(Conf *, int, const FontSpec *)");
  }
  if (valuetypes[primary] == 5) {
    (entry->key).primary = primary;
    pFVar1 = fontspec_copy(value);
    (entry->value).u.fontval = pFVar1;
    conf_insert(conf,entry);
    return;
  }
  __assert_fail("valuetypes[primary] == TYPE_FONT",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                0x1f1,"void conf_set_fontspec(Conf *, int, const FontSpec *)");
}

Assistant:

void conf_set_fontspec(Conf *conf, int primary, const FontSpec *value)
{
    struct conf_entry *entry = snew(struct conf_entry);

    assert(subkeytypes[primary] == TYPE_NONE);
    assert(valuetypes[primary] == TYPE_FONT);
    entry->key.primary = primary;
    entry->value.u.fontval = fontspec_copy(value);
    conf_insert(conf, entry);
}